

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuLaunchData.cpp
# Opt level: O0

void __thiscall
xmrig::CpuLaunchData::CpuLaunchData
          (CpuLaunchData *this,Miner *miner,CpuConfig *config,CpuThread *thread)

{
  bool bVar1;
  int iVar2;
  Assembly *pAVar3;
  int64_t iVar4;
  uint *puVar5;
  CpuThread *in_RCX;
  CpuConfig *in_RDX;
  char *in_RSI;
  CpuConfig *in_RDI;
  uint local_28;
  uint32_t local_24;
  CpuThread *local_20;
  CpuConfig *local_18;
  char *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pAVar3 = CpuConfig::assembly(in_RDX);
  in_RDI->m_aes = pAVar3->m_id;
  bVar1 = CpuConfig::isHugePages(local_18);
  *(bool *)&(in_RDI->m_assembly).m_id = bVar1;
  bVar1 = CpuConfig::isHwAES(in_RDI);
  *(bool *)((long)&(in_RDI->m_assembly).m_id + 1) = bVar1;
  iVar2 = CpuConfig::priority(local_18);
  in_RDI->m_enabled = (bool)(char)iVar2;
  in_RDI->m_hugePages = (bool)(char)((uint)iVar2 >> 8);
  in_RDI->m_shouldSave = (bool)(char)((uint)iVar2 >> 0x10);
  in_RDI->field_0xb = (char)((uint)iVar2 >> 0x18);
  iVar4 = CpuThread::affinity(local_20);
  *(int64_t *)&in_RDI->m_priority = iVar4;
  (in_RDI->m_argon2Impl).m_data = local_10;
  local_24 = CpuThread::intensity(local_20);
  local_28 = 5;
  puVar5 = std::min<unsigned_int>(&local_24,&local_28);
  *(uint *)&(in_RDI->m_argon2Impl).m_size = *puVar5;
  return;
}

Assistant:

xmrig::CpuLaunchData::CpuLaunchData(const Miner *miner, const CpuConfig &config, const CpuThread &thread) :
    assembly(config.assembly()),
    hugePages(config.isHugePages()),
    hwAES(config.isHwAES()),
    priority(config.priority()),
    affinity(thread.affinity()),
    miner(miner),
    intensity(std::min<uint32_t>(thread.intensity(), 5))
{
}